

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O1

ostream * amrex::operator<<(ostream *os,CoordSys *c)

{
  ostream *poVar1;
  char local_3b [11];
  
  local_3b[0] = '(';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,local_3b,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,c->c_sys);
  local_3b[1] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3b + 1,1);
  local_3b[2] = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_3b + 2,1);
  poVar1 = std::ostream::_M_insert<double>(c->offset[0]);
  local_3b[3] = 0x2c;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3b + 3,1);
  poVar1 = std::ostream::_M_insert<double>(c->offset[1]);
  local_3b[4] = 0x2c;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3b + 4,1);
  poVar1 = std::ostream::_M_insert<double>(c->offset[2]);
  local_3b[5] = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3b + 5,1);
  local_3b[6] = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_3b + 6,1);
  poVar1 = std::ostream::_M_insert<double>(c->dx[0]);
  local_3b[7] = 0x2c;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3b + 7,1);
  poVar1 = std::ostream::_M_insert<double>(c->dx[1]);
  local_3b[8] = 0x2c;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3b + 8,1);
  poVar1 = std::ostream::_M_insert<double>(c->dx[2]);
  local_3b[9] = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3b + 9,1);
  local_3b[10] = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,local_3b + 10,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)c->ok);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\n",2);
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream&   os,
            const CoordSys& c)
{
    os << '(' << (int) c.Coord() << ' ';
    os << AMREX_D_TERM( '(' << c.Offset(0) , <<
                  ',' << c.Offset(1) , <<
                  ',' << c.Offset(2))  << ')';
    os << AMREX_D_TERM( '(' << c.CellSize(0) , <<
                  ',' << c.CellSize(1) , <<
                  ',' << c.CellSize(2))  << ')';
    os << ' ' << int(c.ok) << ")\n";
    return os;
}